

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O1

int __thiscall
Inter_Symbol_Generator::Matrix_A_Generator(Inter_Symbol_Generator *this,Array_Data_Symbol *p)

{
  uint uVar1;
  uint8_t **ppuVar2;
  int in_ECX;
  int extraout_EDX;
  uint unaff_EBX;
  Inter_Symbol_Generator *this_00;
  long in_R8;
  uint in_R9D;
  ulong uVar3;
  long lVar4;
  
  this_00 = (Inter_Symbol_Generator *)this->_A;
  if (this_00 != (Inter_Symbol_Generator *)0x0) {
    operator_delete(this_00,8);
  }
  ppuVar2 = new_matrix(this_00,p->L,p->L);
  this->_A = ppuVar2;
  LDPC_Matrix_Generator(this,p);
  uVar1 = HALF_Matrix_Generator(this,p);
  if (in_R9D < extraout_EDX + in_R9D) {
    uVar3 = (ulong)in_R9D;
    do {
      if (unaff_EBX < in_ECX + unaff_EBX) {
        lVar4 = 0;
        do {
          *(undefined1 *)(lVar4 + *(long *)(in_R8 + uVar3 * 8) + (ulong)unaff_EBX) =
               *(undefined1 *)(*(long *)((long)p + (uVar3 - in_R9D) * 8) + lVar4);
          lVar4 = lVar4 + 1;
        } while (((ulong)unaff_EBX - (ulong)(in_ECX + unaff_EBX)) + lVar4 != 0);
      }
      uVar3 = uVar3 + 1;
      uVar1 = unaff_EBX;
    } while (uVar3 != extraout_EDX + in_R9D);
  }
  return uVar1;
}

Assistant:

int Inter_Symbol_Generator::Matrix_A_Generator(class Array_Data_Symbol *p)
{

	if (_A != NULL)
	{
		delete _A;
	}

	_A = new_matrix(p->L, p->L);


	LDPC_Matrix_Generator(p);
	HALF_Matrix_Generator(p);
	I_S_Matrix_Generator(p);
	I_H_Matrix_Generator(p);
	Zero_SxH_Matrix_Generator(p);
	G_LT_Matrix_Generator(p);


	matrix_copy_to(G_LDPC, p->S, p->K, _A, 0, 0);
	matrix_copy_to(I_S, p->S, p->S, _A, 0, p->K);
	matrix_copy_to(Zero_SxH, p->S, p->H, _A, 0, (p->K + p->S));
	matrix_copy_to(G_HALF, p->H, (p->K + p->S), _A, p->S, 0);
	matrix_copy_to(I_H, p->H, p->H, _A, p->S, (p->K + p->S));
	matrix_copy_to(G_LT, p->K, p->L, _A, (p->S + p->H), 0);

	A.resize(p->L, p->L);
	//matrix_A = boost::numeric::ublas::make_matrix_from_pointer(A);

	for (int i = 0; i < p->L; i++)
	{
		for (int j = 0; j < p->L; j++)
		{
			A(i,j) = _A[i][j];
		}
	}
	return 0;
}